

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

void Saig_ManCexMinCollectReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vReason,int fPiReason)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pObj_00;
  uint uVar6;
  uint uVar7;
  
LAB_005786dc:
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  pObj->TravId = p->nTravIds;
  uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar2 = uVar4 & 7;
  if (uVar2 == 2) {
    if (fPiReason == 0) {
      if ((pObj->field_0).CioId < p->nTruePis) {
        return;
      }
      iVar3 = (pObj->field_0).CioId - p->nTruePis;
      if ((pObj->field_0).CioId < p->nTruePis) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x58,"int Saig_ObjRegId(Aig_Man_t *, Aig_Obj_t *)");
      }
      if (-1 < (pObj->field_5).iData) {
        if (iVar3 < 0) goto LAB_00578957;
        uVar2 = ((pObj->field_5).iData & 1U) + iVar3 * 2;
        goto LAB_005788a7;
      }
    }
    else {
      if (p->nTruePis <= (pObj->field_0).CioId) {
        return;
      }
      if (-1 < (pObj->field_5).iData) {
        if ((pObj->field_0).CioId < 0) {
LAB_00578957:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar2 = ((pObj->field_5).iData & 1U) + (pObj->field_0).CioId * 2;
LAB_005788a7:
        Vec_IntPush(vReason,uVar2 ^ 1);
        return;
      }
    }
  }
  else {
    if (uVar2 == 3) {
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      goto LAB_005786dc;
    }
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar2 == 1) {
      return;
    }
    if ((uVar4 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                    ,0x180,
                    "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                   );
    }
    if ((pObj->field_5).iData < 0) goto LAB_005788bc;
    pObj_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    uVar2 = (pObj_00->field_5).iData;
    uVar4 = (uint)pObj->pFanin0;
    if (((pObj->field_5).iData & 1U) == 0) {
      if (-1 < (int)uVar2) {
        pAVar5 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        uVar1 = (pAVar5->field_5).iData;
        if (-1 < (int)uVar1) {
          uVar7 = uVar2 & 1;
          uVar4 = uVar4 & 1;
          uVar6 = ((uint)pObj->pFanin1 ^ uVar1) & 1;
          if ((uVar7 != uVar4) && (uVar6 != 0)) {
            __assert_fail("!fPhase0 || !fPhase1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                          ,0x18d,
                          "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          if ((((uVar7 != uVar4) || (pObj = pObj_00, uVar6 == 0)) &&
              ((uVar7 == uVar4 || (pObj = pAVar5, uVar6 != 0)))) &&
             (pObj = pObj_00, uVar2 >> 1 < uVar1 >> 1)) {
            pObj = pAVar5;
          }
          goto LAB_005786dc;
        }
      }
    }
    else if (-1 < (int)uVar2) {
      uVar1 = *(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28);
      if (-1 < (int)uVar1) {
        if (((uVar1 ^ (uint)pObj->pFanin1) & (uVar2 ^ uVar4) & 1) == 0) {
          __assert_fail("fPhase0 && fPhase1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                        ,0x185,
                        "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                       );
        }
        Saig_ManCexMinCollectReason_rec(p,pObj_00,vReason,fPiReason);
        pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        goto LAB_005786dc;
      }
    }
  }
LAB_005788bc:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x130,"int Abc_LitIsCompl(int)");
}

Assistant:

void Saig_ManCexMinCollectReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vReason, int fPiReason )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( fPiReason && Saig_ObjIsPi(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Aig_ObjCioId(pObj), !Abc_LitIsCompl(pObj->iData) ) );
        else if ( !fPiReason && Saig_ObjIsLo(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Saig_ObjRegId(p, pObj), !Abc_LitIsCompl(pObj->iData) ) );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    if ( Abc_LitIsCompl(pObj->iData) ) // value 1
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( fPhase0 && fPhase1 );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
    }
    else
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        else if ( fPhase0 && !fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        else 
        {
            int iPrio0 = Abc_Lit2Var( Aig_ObjFanin0(pObj)->iData );
            int iPrio1 = Abc_Lit2Var( Aig_ObjFanin1(pObj)->iData );
            if ( iPrio0 >= iPrio1 )
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
            else
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        }
    }
}